

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_chorba_c.c
# Opt level: O2

uint32_t crc32_chorba_32768_nondestructive(uint32_t crc,uint64_t *buf,size_t len)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint64_t final [9];
  uint64_t bitbuffer [4096];
  ulong local_8088;
  ulong uStack_8080;
  ulong local_8078;
  ulong uStack_8070;
  ulong local_8068;
  undefined8 uStack_8060;
  undefined8 local_8058;
  undefined8 uStack_8050;
  undefined8 local_8048;
  undefined8 local_8038;
  undefined8 uStack_8030;
  undefined8 uStack_8028;
  undefined8 uStack_8020;
  uint auStack_8018 [282];
  uint auStack_7bb0 [76];
  uint auStack_7a80 [56];
  uint auStack_79a0 [178];
  uint auStack_76d8 [7594];
  
  memset(&local_8038,0,0x8000);
  local_8038 = (ulong)crc;
  for (lVar7 = 0; lVar7 + 0x9a0U < len; lVar7 = lVar7 + 0x40) {
    puVar1 = (uint *)((long)buf + lVar7);
    uVar11 = *puVar1 ^ *(uint *)((long)&local_8038 + lVar7);
    uVar12 = puVar1[1] ^ *(uint *)((long)&local_8038 + lVar7 + 4);
    uVar13 = puVar1[2] ^ *(uint *)((long)&uStack_8030 + lVar7);
    uVar14 = puVar1[3] ^ *(uint *)((long)&uStack_8030 + lVar7 + 4);
    *(uint *)((long)auStack_7bb0 + lVar7) = *(uint *)((long)auStack_7bb0 + lVar7) ^ uVar11;
    *(uint *)((long)auStack_7bb0 + lVar7 + 4) = *(uint *)((long)auStack_7bb0 + lVar7 + 4) ^ uVar12;
    *(uint *)((long)auStack_7bb0 + lVar7 + 8) = *(uint *)((long)auStack_7bb0 + lVar7 + 8) ^ uVar13;
    *(uint *)((long)auStack_7bb0 + lVar7 + 0xc) =
         *(uint *)((long)auStack_7bb0 + lVar7 + 0xc) ^ uVar14;
    puVar1 = (uint *)((long)buf + lVar7 + 0x10);
    uVar15 = *puVar1 ^ *(uint *)((long)&uStack_8028 + lVar7);
    uVar16 = puVar1[1] ^ *(uint *)((long)&uStack_8028 + lVar7 + 4);
    uVar17 = puVar1[2] ^ *(uint *)((long)&uStack_8020 + lVar7);
    uVar18 = puVar1[3] ^ *(uint *)((long)auStack_8018 + lVar7 + -4);
    *(uint *)((long)auStack_7bb0 + lVar7 + 0x10) =
         *(uint *)((long)auStack_7bb0 + lVar7 + 0x10) ^ uVar15;
    *(uint *)((long)auStack_7bb0 + lVar7 + 0x14) =
         *(uint *)((long)auStack_7bb0 + lVar7 + 0x14) ^ uVar16;
    *(uint *)((long)auStack_7bb0 + lVar7 + 0x18) =
         *(uint *)((long)auStack_7bb0 + lVar7 + 0x18) ^ uVar17;
    *(uint *)((long)auStack_7bb0 + lVar7 + 0x1c) =
         *(uint *)((long)auStack_7bb0 + lVar7 + 0x1c) ^ uVar18;
    puVar1 = (uint *)((long)buf + lVar7 + 0x20);
    uVar19 = *puVar1 ^ *(uint *)((long)auStack_8018 + lVar7);
    uVar20 = puVar1[1] ^ *(uint *)((long)auStack_8018 + lVar7 + 4);
    uVar21 = puVar1[2] ^ *(uint *)((long)auStack_8018 + lVar7 + 8);
    uVar22 = puVar1[3] ^ *(uint *)((long)auStack_8018 + lVar7 + 0xc);
    *(uint *)((long)auStack_7bb0 + lVar7 + 0x20) =
         *(uint *)((long)auStack_7bb0 + lVar7 + 0x20) ^ uVar19;
    *(uint *)((long)auStack_7bb0 + lVar7 + 0x24) =
         *(uint *)((long)auStack_7bb0 + lVar7 + 0x24) ^ uVar20;
    *(uint *)((long)auStack_7bb0 + lVar7 + 0x28) =
         *(uint *)((long)auStack_7bb0 + lVar7 + 0x28) ^ uVar21;
    *(uint *)((long)auStack_7bb0 + lVar7 + 0x2c) =
         *(uint *)((long)auStack_7bb0 + lVar7 + 0x2c) ^ uVar22;
    puVar1 = (uint *)((long)buf + lVar7 + 0x30);
    uVar23 = *puVar1 ^ *(uint *)((long)auStack_8018 + lVar7 + 0x10);
    uVar24 = puVar1[1] ^ *(uint *)((long)auStack_8018 + lVar7 + 0x14);
    uVar25 = puVar1[2] ^ *(uint *)((long)auStack_8018 + lVar7 + 0x18);
    uVar26 = puVar1[3] ^ *(uint *)((long)auStack_8018 + lVar7 + 0x1c);
    *(uint *)((long)auStack_7bb0 + lVar7 + 0x30) =
         *(uint *)((long)auStack_7bb0 + lVar7 + 0x30) ^ uVar23;
    *(uint *)((long)auStack_7bb0 + lVar7 + 0x34) =
         *(uint *)((long)auStack_7bb0 + lVar7 + 0x34) ^ uVar24;
    *(uint *)((long)auStack_7bb0 + lVar7 + 0x38) =
         *(uint *)((long)auStack_7bb0 + lVar7 + 0x38) ^ uVar25;
    *(uint *)((long)auStack_7bb0 + lVar7 + 0x3c) =
         *(uint *)((long)auStack_7bb0 + lVar7 + 0x3c) ^ uVar26;
    *(uint *)((long)auStack_7a80 + lVar7) = *(uint *)((long)auStack_7a80 + lVar7) ^ uVar11;
    *(uint *)((long)auStack_7a80 + lVar7 + 4) = *(uint *)((long)auStack_7a80 + lVar7 + 4) ^ uVar12;
    *(uint *)((long)auStack_7a80 + lVar7 + 8) = *(uint *)((long)auStack_7a80 + lVar7 + 8) ^ uVar13;
    *(uint *)((long)auStack_7a80 + lVar7 + 0xc) =
         *(uint *)((long)auStack_7a80 + lVar7 + 0xc) ^ uVar14;
    *(uint *)((long)auStack_7a80 + lVar7 + 0x10) =
         *(uint *)((long)auStack_7a80 + lVar7 + 0x10) ^ uVar15;
    *(uint *)((long)auStack_7a80 + lVar7 + 0x14) =
         *(uint *)((long)auStack_7a80 + lVar7 + 0x14) ^ uVar16;
    *(uint *)((long)auStack_7a80 + lVar7 + 0x18) =
         *(uint *)((long)auStack_7a80 + lVar7 + 0x18) ^ uVar17;
    *(uint *)((long)auStack_7a80 + lVar7 + 0x1c) =
         *(uint *)((long)auStack_7a80 + lVar7 + 0x1c) ^ uVar18;
    *(uint *)((long)auStack_7a80 + lVar7 + 0x20) =
         *(uint *)((long)auStack_7a80 + lVar7 + 0x20) ^ uVar19;
    *(uint *)((long)auStack_7a80 + lVar7 + 0x24) =
         *(uint *)((long)auStack_7a80 + lVar7 + 0x24) ^ uVar20;
    *(uint *)((long)auStack_7a80 + lVar7 + 0x28) =
         *(uint *)((long)auStack_7a80 + lVar7 + 0x28) ^ uVar21;
    *(uint *)((long)auStack_7a80 + lVar7 + 0x2c) =
         *(uint *)((long)auStack_7a80 + lVar7 + 0x2c) ^ uVar22;
    *(uint *)((long)auStack_7a80 + lVar7 + 0x30) =
         *(uint *)((long)auStack_7a80 + lVar7 + 0x30) ^ uVar23;
    *(uint *)((long)auStack_7a80 + lVar7 + 0x34) =
         *(uint *)((long)auStack_7a80 + lVar7 + 0x34) ^ uVar24;
    *(uint *)((long)auStack_7a80 + lVar7 + 0x38) =
         *(uint *)((long)auStack_7a80 + lVar7 + 0x38) ^ uVar25;
    *(uint *)((long)auStack_7a80 + lVar7 + 0x3c) =
         *(uint *)((long)auStack_7a80 + lVar7 + 0x3c) ^ uVar26;
    *(uint *)((long)auStack_79a0 + lVar7) = *(uint *)((long)auStack_79a0 + lVar7) ^ uVar11;
    *(uint *)((long)auStack_79a0 + lVar7 + 4) = *(uint *)((long)auStack_79a0 + lVar7 + 4) ^ uVar12;
    *(uint *)((long)auStack_79a0 + lVar7 + 8) = *(uint *)((long)auStack_79a0 + lVar7 + 8) ^ uVar13;
    *(uint *)((long)auStack_79a0 + lVar7 + 0xc) =
         *(uint *)((long)auStack_79a0 + lVar7 + 0xc) ^ uVar14;
    *(uint *)((long)auStack_79a0 + lVar7 + 0x10) =
         *(uint *)((long)auStack_79a0 + lVar7 + 0x10) ^ uVar15;
    *(uint *)((long)auStack_79a0 + lVar7 + 0x14) =
         *(uint *)((long)auStack_79a0 + lVar7 + 0x14) ^ uVar16;
    *(uint *)((long)auStack_79a0 + lVar7 + 0x18) =
         *(uint *)((long)auStack_79a0 + lVar7 + 0x18) ^ uVar17;
    *(uint *)((long)auStack_79a0 + lVar7 + 0x1c) =
         *(uint *)((long)auStack_79a0 + lVar7 + 0x1c) ^ uVar18;
    *(uint *)((long)auStack_79a0 + lVar7 + 0x20) =
         *(uint *)((long)auStack_79a0 + lVar7 + 0x20) ^ uVar19;
    *(uint *)((long)auStack_79a0 + lVar7 + 0x24) =
         *(uint *)((long)auStack_79a0 + lVar7 + 0x24) ^ uVar20;
    *(uint *)((long)auStack_79a0 + lVar7 + 0x28) =
         *(uint *)((long)auStack_79a0 + lVar7 + 0x28) ^ uVar21;
    *(uint *)((long)auStack_79a0 + lVar7 + 0x2c) =
         *(uint *)((long)auStack_79a0 + lVar7 + 0x2c) ^ uVar22;
    *(uint *)((long)auStack_79a0 + lVar7 + 0x30) =
         *(uint *)((long)auStack_79a0 + lVar7 + 0x30) ^ uVar23;
    *(uint *)((long)auStack_79a0 + lVar7 + 0x34) =
         *(uint *)((long)auStack_79a0 + lVar7 + 0x34) ^ uVar24;
    *(uint *)((long)auStack_79a0 + lVar7 + 0x38) =
         *(uint *)((long)auStack_79a0 + lVar7 + 0x38) ^ uVar25;
    *(uint *)((long)auStack_79a0 + lVar7 + 0x3c) =
         *(uint *)((long)auStack_79a0 + lVar7 + 0x3c) ^ uVar26;
    *(uint *)((long)auStack_76d8 + lVar7) = uVar11;
    *(uint *)((long)auStack_76d8 + lVar7 + 4) = uVar12;
    *(uint *)((long)auStack_76d8 + lVar7 + 8) = uVar13;
    *(uint *)((long)auStack_76d8 + lVar7 + 0xc) = uVar14;
    *(uint *)((long)auStack_76d8 + lVar7 + 0x10) = uVar15;
    *(uint *)((long)auStack_76d8 + lVar7 + 0x14) = uVar16;
    *(uint *)((long)auStack_76d8 + lVar7 + 0x18) = uVar17;
    *(uint *)((long)auStack_76d8 + lVar7 + 0x1c) = uVar18;
    *(uint *)((long)auStack_76d8 + lVar7 + 0x20) = uVar19;
    *(uint *)((long)auStack_76d8 + lVar7 + 0x24) = uVar20;
    *(uint *)((long)auStack_76d8 + lVar7 + 0x28) = uVar21;
    *(uint *)((long)auStack_76d8 + lVar7 + 0x2c) = uVar22;
    *(uint *)((long)auStack_76d8 + lVar7 + 0x30) = uVar23;
    *(uint *)((long)auStack_76d8 + lVar7 + 0x34) = uVar24;
    *(uint *)((long)auStack_76d8 + lVar7 + 0x38) = uVar25;
    *(uint *)((long)auStack_76d8 + lVar7 + 0x3c) = uVar26;
  }
  local_8058 = 0;
  uStack_8050 = 0;
  local_8068 = 0;
  uStack_8060 = 0;
  local_8078 = 0;
  uStack_8070 = 0;
  local_8088 = 0;
  uStack_8080 = 0;
  local_8048 = 0;
  uVar5 = 0;
  uVar8 = 0;
  uVar4 = 0;
  uVar9 = 0;
  uVar6 = 0;
  for (; lVar7 + 0x48U < len; lVar7 = lVar7 + 0x20) {
    uVar6 = *(ulong *)((long)buf + lVar7) ^ *(ulong *)((long)&local_8038 + lVar7) ^ uVar6;
    uVar3 = *(ulong *)((long)buf + lVar7 + 8) ^ *(ulong *)((long)&uStack_8030 + lVar7) ^ uVar9;
    uVar2 = uVar6 << 0x37 ^ *(ulong *)((long)buf + lVar7 + 0x10) ^ uVar6 << 0x11 ^
            *(ulong *)((long)&uStack_8028 + lVar7) ^ uVar4;
    uVar10 = uVar2 << 0x11 ^ uVar5;
    uVar5 = uVar6 << 0x13 ^ uVar6 >> 9 ^ uVar6 >> 0x2f ^ *(ulong *)((long)buf + lVar7 + 0x18) ^
            uVar3 << 0x37 ^ uVar3 << 0x11 ^ *(ulong *)((long)&uStack_8020 + lVar7) ^ uVar8;
    uVar9 = uVar5 << 0x37 ^
            uVar2 << 0x13 ^ uVar2 >> 0x2f ^
            uVar2 >> 9 ^ (uVar3 << 0x2c | uVar3 >> 0x2d) ^ uVar6 >> 0x14 ^ uVar5 << 0x11;
    uVar4 = uVar5 << 0x13 ^ uVar5 >> 0x2f ^
            uVar5 >> 9 ^ (uVar2 << 0x2c | uVar2 >> 0x2d) ^ uVar3 >> 0x14;
    uVar8 = (uVar5 << 0x2c | uVar5 >> 0x2d) ^ uVar2 >> 0x14;
    uVar5 = uVar5 >> 0x14;
    uVar6 = uVar10 ^ uVar2 << 0x37 ^
                     uVar3 << 0x13 ^ uVar3 >> 9 ^ uVar3 >> 0x2f ^ (uVar6 << 0x2c | uVar6 >> 0x2d);
  }
  memcpy(&local_8088,(void *)((long)buf + lVar7),len - lVar7);
  local_8088 = local_8088 ^ uVar6;
  uStack_8080 = uStack_8080 ^ uVar9;
  local_8078 = local_8078 ^ uVar4;
  uStack_8070 = uStack_8070 ^ uVar8;
  local_8068 = local_8068 ^ uVar5;
  uVar11 = 0;
  for (uVar4 = 0; uVar4 < len - lVar7; uVar4 = uVar4 + 1) {
    uVar11 = uVar11 >> 8 ^
             crc_table[(byte)(*(byte *)((long)&local_8088 + uVar4) ^ (byte)uVar11 ^
                             *(byte *)((long)&local_8038 + lVar7 + uVar4))];
  }
  return uVar11;
}

Assistant:

Z_INTERNAL uint32_t crc32_chorba_32768_nondestructive (uint32_t crc, const uint64_t* buf, size_t len) {
    const uint64_t* input = buf;
    uint64_t bitbuffer[32768 / sizeof(uint64_t)];
    const uint8_t* bitbufferbytes = (const uint8_t*) bitbuffer;
    memset(bitbuffer, 0, 32768);
    bitbuffer[0] ^= crc;
    crc = 0;

    size_t i = 0;

    for(; i + 300*8+64 < len; i += 64) {
        uint64_t in1, in2, in3, in4;
        uint64_t in5, in6, in7, in8;
        size_t inoffset = (i/8);

        in1 = input[i / sizeof(uint64_t) + 0] ^ bitbuffer[inoffset + 0];
        in2 = input[i / sizeof(uint64_t) + 1] ^ bitbuffer[inoffset + 1];
        in3 = input[i / sizeof(uint64_t) + 2] ^ bitbuffer[inoffset + 2];
        in4 = input[i / sizeof(uint64_t) + 3] ^ bitbuffer[inoffset + 3];
        in5 = input[i / sizeof(uint64_t) + 4] ^ bitbuffer[inoffset + 4];
        in6 = input[i / sizeof(uint64_t) + 5] ^ bitbuffer[inoffset + 5];
        in7 = input[i / sizeof(uint64_t) + 6] ^ bitbuffer[inoffset + 6];
        in8 = input[i / sizeof(uint64_t) + 7] ^ bitbuffer[inoffset + 7];

        // [0, 145, 183, 211]

        bitbuffer[(i/8 + 0 + 145)] ^= in1;
        bitbuffer[(i/8 + 1 + 145)] ^= in2;
        bitbuffer[(i/8 + 2 + 145)] ^= in3;
        bitbuffer[(i/8 + 3 + 145)] ^= in4;
        bitbuffer[(i/8 + 4 + 145)] ^= in5;
        bitbuffer[(i/8 + 5 + 145)] ^= in6;
        bitbuffer[(i/8 + 6 + 145)] ^= in7;
        bitbuffer[(i/8 + 7 + 145)] ^= in8;

        bitbuffer[(i/8 + 0 + 183)] ^= in1;
        bitbuffer[(i/8 + 1 + 183)] ^= in2;
        bitbuffer[(i/8 + 2 + 183)] ^= in3;
        bitbuffer[(i/8 + 3 + 183)] ^= in4;
        bitbuffer[(i/8 + 4 + 183)] ^= in5;
        bitbuffer[(i/8 + 5 + 183)] ^= in6;
        bitbuffer[(i/8 + 6 + 183)] ^= in7;
        bitbuffer[(i/8 + 7 + 183)] ^= in8;

        bitbuffer[(i/8 + 0 + 211)] ^= in1;
        bitbuffer[(i/8 + 1 + 211)] ^= in2;
        bitbuffer[(i/8 + 2 + 211)] ^= in3;
        bitbuffer[(i/8 + 3 + 211)] ^= in4;
        bitbuffer[(i/8 + 4 + 211)] ^= in5;
        bitbuffer[(i/8 + 5 + 211)] ^= in6;
        bitbuffer[(i/8 + 6 + 211)] ^= in7;
        bitbuffer[(i/8 + 7 + 211)] ^= in8;

        bitbuffer[(i/8 + 0 + 300)] = in1;
        bitbuffer[(i/8 + 1 + 300)] = in2;
        bitbuffer[(i/8 + 2 + 300)] = in3;
        bitbuffer[(i/8 + 3 + 300)] = in4;
        bitbuffer[(i/8 + 4 + 300)] = in5;
        bitbuffer[(i/8 + 5 + 300)] = in6;
        bitbuffer[(i/8 + 6 + 300)] = in7;
        bitbuffer[(i/8 + 7 + 300)] = in8;
    }

    uint64_t next1_64 = 0;
    uint64_t next2_64 = 0;
    uint64_t next3_64 = 0;
    uint64_t next4_64 = 0;
    uint64_t next5_64 = 0;
    uint64_t final[9] = {0};

    for(; (i + 72 < len); i += 32) {
        uint64_t in1;
        uint64_t in2;
        uint64_t in3;
        uint64_t in4;
        uint64_t a1, a2, a3, a4;
        uint64_t b1, b2, b3, b4;
        uint64_t c1, c2, c3, c4;
        uint64_t d1, d2, d3, d4;

        uint64_t out1;
        uint64_t out2;
        uint64_t out3;
        uint64_t out4;
        uint64_t out5;

        in1 = input[i / sizeof(z_word_t)] ^ bitbuffer[(i / sizeof(uint64_t))];
        in2 = input[(i + 8) / sizeof(z_word_t)] ^ bitbuffer[(i / sizeof(uint64_t) + 1)];
#if BYTE_ORDER == BIG_ENDIAN
        in1 = ZSWAP64(in1);
        in2 = ZSWAP64(in2);
#endif
        in1 ^= next1_64;
        in2 ^= next2_64;

        a1 = (in1 << 17) ^ (in1 << 55);
        a2 = (in1 >> 47) ^ (in1 >> 9) ^ (in1 << 19);
        a3 = (in1 >> 45) ^ (in1 << 44);
        a4 = (in1 >> 20);

        b1 = (in2 << 17) ^ (in2 << 55);
        b2 = (in2 >> 47) ^ (in2 >> 9) ^ (in2 << 19);
        b3 = (in2 >> 45) ^ (in2 << 44);
        b4 = (in2 >> 20);

        in3 = input[(i + 16) / sizeof(z_word_t)] ^ bitbuffer[(i / sizeof(uint64_t) + 2)];
        in4 = input[(i + 24) / sizeof(z_word_t)] ^ bitbuffer[(i / sizeof(uint64_t) + 3)];
#if BYTE_ORDER == BIG_ENDIAN
        in3 = ZSWAP64(in3);
        in4 = ZSWAP64(in4);
#endif
        in3 ^= next3_64 ^ a1;
        in4 ^= next4_64 ^ a2 ^ b1;

        c1 = (in3 << 17) ^ (in3 << 55);
        c2 = (in3 >> 47) ^ (in3 >> 9) ^ (in3 << 19);
        c3 = (in3 >> 45) ^ (in3 << 44);
        c4 = (in3 >> 20);

        d1 = (in4 << 17) ^ (in4 << 55);
        d2 = (in4 >> 47) ^ (in4 >> 9) ^ (in4 << 19);
        d3 = (in4 >> 45) ^ (in4 << 44);
        d4 = (in4 >> 20);

        out1 = a3 ^ b2 ^ c1;
        out2 = a4 ^ b3 ^ c2 ^ d1;
        out3 = b4 ^ c3 ^ d2;
        out4 = c4 ^ d3;
        out5 = d4;

        next1_64 = next5_64 ^ out1;
        next2_64 = out2;
        next3_64 = out3;
        next4_64 = out4;
        next5_64 = out5;

    }

#if BYTE_ORDER == BIG_ENDIAN
    next1_64 = ZSWAP64(next1_64);
    next2_64 = ZSWAP64(next2_64);
    next3_64 = ZSWAP64(next3_64);
    next4_64 = ZSWAP64(next4_64);
    next5_64 = ZSWAP64(next5_64);
#endif

    memcpy(final, input+(i / sizeof(uint64_t)), len-i);
    final[0] ^= next1_64;
    final[1] ^= next2_64;
    final[2] ^= next3_64;
    final[3] ^= next4_64;
    final[4] ^= next5_64;

    uint8_t* final_bytes = (uint8_t*) final;

    for(size_t j = 0; j < (len-i); j++) {
        crc = crc_table[(crc ^ final_bytes[j] ^ bitbufferbytes[(j+i)]) & 0xff] ^ (crc >> 8);
    }
    return crc;
}